

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseDuration<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  size_t x;
  char cVar1;
  Status SVar2;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar3;
  uintptr_t extraout_RAX;
  Field pFVar4;
  _Optional_payload_base<int> _Var5;
  char *pcVar6;
  undefined8 uVar7;
  _Optional_payload_base<int> _Var8;
  string_view sVar9;
  string_view rest;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  string_view local_a0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_90;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_88;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_58;
  char *local_38;
  
  JsonLexer::PeekKind((JsonLexer *)&local_90.status_);
  aVar3 = local_90;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_90.status_);
  if ((aVar3 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_88._0_4_ == 6)) {
    SVar2 = JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    return (Status)SVar2.rep_;
  }
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&local_90.status_,lex);
  *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
    *)this = local_90;
  aVar3 = local_90;
  if (((ulong)local_90 & 1) == 0) {
    LOCK();
    *(int *)local_90 = *(int *)local_90 + 1;
    UNLOCK();
    aVar3.status_.rep_ = *(Status *)this;
  }
  if (aVar3 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                )0x1) goto LAB_002bf2a2;
  if (local_90 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
    sVar9 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_88._M_first);
    _Var5 = (_Optional_payload_base<int>)sVar9._M_len;
    if (_Var5 == (_Optional_payload_base<int>)0x0) {
LAB_002bf256:
      if (local_90 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid
                  ((JsonLocation *)this,&local_58,0x23,"duration must start with an integer");
LAB_002bf2a2:
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_90.status_);
        return (Status)extraout_RAX;
      }
      goto LAB_002bf3bd;
    }
    _Var8._M_payload = (_Storage<int,_true>)0x0;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    do {
      lex = (JsonLexer *)_Var8;
      if (sVar9._M_str[(long)_Var8] != '-' && 9 < (byte)(sVar9._M_str[(long)_Var8] - 0x30U)) break;
      _Var8 = (_Optional_payload_base<int>)((long)_Var8 + 1);
      lex = (JsonLexer *)_Var5;
    } while (_Var5 != _Var8);
    if ((_Optional_payload_base<int>)lex == (_Optional_payload_base<int>)0x0) goto LAB_002bf256;
    if (local_90 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002bf3c7;
    sVar9 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_88._M_first);
    pcVar6 = sVar9._M_str;
    _Var8 = (_Optional_payload_base<int>)sVar9._M_len;
    _Var5 = (_Optional_payload_base<int>)lex;
    if ((ulong)_Var8 < lex) {
      _Var5 = _Var8;
    }
    cVar1 = absl::lts_20240722::numbers_internal::safe_strto64_base(_Var5,pcVar6,&local_a0,10);
    x = local_a0._M_len;
    if (cVar1 == '\0') {
      if (local_90 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar6 = "duration had bad seconds";
        uVar7 = 0x18;
        goto LAB_002bf295;
      }
      goto LAB_002bf3d1;
    }
    local_38 = pcVar6;
    if (local_a0._M_len - 0x4979cb9e01 < 0xffffff6d0c68c3ff) {
      if (local_90 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) goto LAB_002bf3d1;
      pcVar6 = "duration out of range";
      uVar7 = 0x15;
LAB_002bf295:
      JsonLocation::Invalid((JsonLocation *)this,&local_58,uVar7,pcVar6);
      goto LAB_002bf2a2;
    }
    if (local_90 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002bf3db;
    sVar9 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_88._M_first);
    _Var5 = (_Optional_payload_base<int>)sVar9._M_len;
    if ((ulong)_Var5 < lex) goto LAB_002bf3f9;
    local_a0._M_len = (long)_Var5 - (long)lex;
    local_a0._M_str = sVar9._M_str + (long)lex;
    lex = (JsonLexer *)TakeNanosAndAdvance(&local_a0);
    if (((ulong)lex >> 0x20 & 1) == 0) {
      if (local_90 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)this,&local_58,0x1c,"duration had bad nanoseconds");
        goto LAB_002bf2a2;
      }
      goto LAB_002bf3e5;
    }
    if (((long)x < 0) || ((_Var8 != (_Optional_payload_base<int>)0x0 && (*local_38 == '-')))) {
      lex._0_4_ = -(int)lex;
      lex._4_4_ = 0;
    }
    if ((local_a0._M_len == 1) && (*local_a0._M_str == 's')) {
      pFVar4 = Proto2Descriptor::MustHaveField(desc,1);
      ParseProto2Descriptor::SetInt64(pFVar4,msg,x);
      pFVar4 = Proto2Descriptor::MustHaveField(desc,2);
      ParseProto2Descriptor::SetInt32(pFVar4,msg,(int)lex);
      *(undefined8 *)this = 1;
      goto LAB_002bf2a2;
    }
    if (local_90 ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&local_58,0x23,"duration must end with a single \'s\'");
      goto LAB_002bf2a2;
    }
  }
  else {
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3bd:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3c7:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3d1:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3db:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3e5:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
  }
  _Var5 = (_Optional_payload_base<int>)
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_90.status_);
LAB_002bf3f9:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",lex,
             _Var5);
}

Assistant:

absl::Status ParseDuration(JsonLexer& lex, const Desc<Traits>& desc,
                           Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  constexpr int64_t kMaxSeconds = int64_t{3652500} * 86400;

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  size_t int_part_end = 0;
  for (char c : str->value.AsView()) {
    if (!absl::ascii_isdigit(c) && c != '-') {
      break;
    }
    ++int_part_end;
  }
  if (int_part_end == 0) {
    return str->loc.Invalid("duration must start with an integer");
  }

  absl::string_view sec_digits = str->value.AsView().substr(0, int_part_end);
  int64_t secs;
  if (!absl::SimpleAtoi(sec_digits, &secs)) {
    return str->loc.Invalid("duration had bad seconds");
  }

  if (secs > kMaxSeconds || secs < -kMaxSeconds) {
    return str->loc.Invalid("duration out of range");
  }

  absl::string_view rest = str->value.AsView().substr(int_part_end);
  auto nanos = TakeNanosAndAdvance(rest);
  if (!nanos.has_value()) {
    return str->loc.Invalid("duration had bad nanoseconds");
  }

  bool isNegative = (secs < 0) || absl::StartsWith(sec_digits, "-");
  if (isNegative) {
    *nanos *= -1;
  }

  if (rest != "s") {
    return str->loc.Invalid("duration must end with a single 's'");
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}